

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall
BoardView::ShowSearchResults<std::__cxx11::string>
          (BoardView *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results,char *search,int *limit,offset_in_BoardView_to_subr onSelect)

{
  pointer pbVar1;
  char *label;
  bool bVar2;
  int iVar3;
  code *pcVar4;
  long in_R9;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r;
  pointer pbVar6;
  ImVec2 local_38;
  
  pbVar6 = (results->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (results->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar1) {
    plVar5 = (long *)((long)&this->m_file + in_R9);
    do {
      label = (pbVar6->_M_dataplus)._M_p;
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar2 = ImGui::Selectable(label,false,0,&local_38);
      if (bVar2) {
        pcVar4 = (code *)onSelect;
        if ((onSelect & 1) != 0) {
          pcVar4 = *(code **)(*plVar5 + -1 + onSelect);
        }
        (*pcVar4)(plVar5,label);
        snprintf(search,0x80,"%s",label);
        iVar3 = -1;
      }
      else {
        iVar3 = *limit + -1;
      }
      *limit = iVar3;
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar1);
  }
  return;
}

Assistant:

void BoardView::ShowSearchResults(std::vector<T> results, char *search, int &limit, void (BoardView::*onSelect)(const char *)) {
	for (auto &r : results) {
		const char *cname = getcname(r);
		if (ImGui::Selectable(cname, false)) {
			(this->*onSelect)(cname);
			snprintf(search, 128, "%s", cname);
			limit = 0;
		}
		limit--;
	}
}